

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

int google::protobuf::internal::WireFormat::MessageSetItemByteSize
              (FieldDescriptor *field,Message *message)

{
  int iVar1;
  uint32 uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  int message_size;
  Message *sub_message;
  int our_size;
  Reflection *message_reflection;
  Message *message_local;
  FieldDescriptor *field_local;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])();
  uVar2 = FieldDescriptor::number(field);
  iVar3 = io::CodedOutputStream::VarintSize32(uVar2);
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xb0))
                             ((long *)CONCAT44(extraout_var,iVar1),message,field,0);
  uVar2 = (**(code **)(*plVar4 + 0x48))();
  iVar1 = io::CodedOutputStream::VarintSize32(uVar2);
  return uVar2 + iVar1 + iVar3 + 4;
}

Assistant:

int WireFormat::MessageSetItemByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  int our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(field->number());

  // message
  const Message& sub_message = message_reflection->GetMessage(message, field);
  int message_size = sub_message.ByteSize();

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}